

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractRoomAction.cpp
# Opt level: O1

ActionResults * __thiscall AbstractRoomAction::Help(AbstractRoomAction *this)

{
  ActionResults *this_00;
  string info;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  string local_40;
  
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "Command options and structure  \n      _________________________________________________  \n      When typing commands, please remove spaces in item descriptions,\n      for example: green key = greenkey or white pillar = whitepillar.\n      GO _____ | ex: GO NORTH  \n      => takes you to the next room in that direction.  \n      LOOK (or) EXAMINE _____ | ex: LOOK TABLE  \n      => examines an item/object/feature more closely  \n      TOUCH ____ | ex: TOUCH STONE  \n      => Interacts with an item/object/feature  \n      PICKUP (or) TAKE ____ | ex: PICKUP STATUE  \n      => attempts to put an item into your inventory  \n      DROP _____ | ex: DROP PAMPHLET  \n      => drops an item from your inventory to the floor  \n      USE _____ | ex: USE ROPE  \n      => uses an item in a way that you deem natural.  \n      OPEN _____ | ex: OPEN DOOR  \n      => Attempts to open an item/object/feature  \n      CLOSE _____ | ex: CLOSE DOOR  \n      => Attempts to close an item/object/feature  \n      HELP | ex: HELP  \n      => Pretty sure you know what this one does...\n      EXIT or QUIT | ex: QUIT \n      => Again, this one speaks for itself..."
             ,"");
  this_00 = (ActionResults *)operator_new(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,local_60,local_60 + local_58);
  ActionResults::ActionResults(this_00,CURRENT,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return this_00;
}

Assistant:

ActionResults * AbstractRoomAction::Open() {

        return new ActionResults(CURRENT, "You can't open that here.");
}